

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_proxy.cpp
# Opt level: O1

void __thiscall TcpProxy::handleConnectRequest(TcpProxy *this,Connection *conn)

{
  _Atomic_word *p_Var1;
  Buffer *this_00;
  TcpClient *pTVar2;
  element_type *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  ushort uVar4;
  int iVar5;
  off_t oVar6;
  char *pcVar7;
  Logger *pLVar8;
  char *pcVar9;
  size_t sVar10;
  TimerId TVar11;
  uint __val;
  uint __len;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  _Any_data local_f8;
  code *local_e8;
  code *pcStack_e0;
  shared_ptr<Liby::TcpClient> tcpClient;
  __shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2> local_c8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  string host;
  string service;
  Timestamp local_78;
  char address [50];
  
  this_00 = &conn->readBuf_;
  oVar6 = Liby::Buffer::size(this_00);
  if (8 < oVar6) {
    pcVar7 = Liby::Buffer::data(this_00);
    if (pcVar7[1] != '\x01' || *pcVar7 != '\x04') {
      pLVar8 = Liby::Logger::getLogger();
      Liby::Logger::log(pLVar8,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      Liby::Connection::destroy(conn);
      return;
    }
    pcVar9 = inet_ntop(2,pcVar7 + 4,address,0x32);
    if (pcVar9 == (char *)0x0) {
      Liby::Connection::destroy(conn);
    }
    else {
      host._M_dataplus._M_p = (pointer)&host.field_2;
      sVar10 = strlen(address);
      std::__cxx11::string::_M_construct<char_const*>((string *)&host,address,address + sVar10);
      uVar4 = *(ushort *)(pcVar7 + 2) << 8 | *(ushort *)(pcVar7 + 2) >> 8;
      __val = (uint)uVar4;
      __len = 1;
      if (((9 < uVar4) && (__len = 2, 99 < uVar4)) && (__len = 3, 999 < __val)) {
        __len = 5 - (__val < 10000);
      }
      service._M_dataplus._M_p = (pointer)&service.field_2;
      std::__cxx11::string::_M_construct((ulong)&service,(char)__len);
      std::__detail::__to_chars_10_impl<unsigned_int>(service._M_dataplus._M_p,__len,__val);
      pLVar8 = Liby::Logger::getLogger();
      Liby::Logger::log(pLVar8,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      Liby::Buffer::retrieve(this_00);
      Liby::EventLoopGroup::creatTcpClient
                ((EventLoopGroup *)&tcpClient,(string *)this->group_,&host);
      _Var3 = tcpClient.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      this_01 = tcpClient.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_78.tv_.tv_sec = 8;
      local_78.tv_.tv_usec = 0;
      if (tcpClient.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (tcpClient.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (tcpClient.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (tcpClient.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (tcpClient.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_e8 = (code *)0x0;
      pcStack_e0 = (code *)0x0;
      local_f8._M_unused._M_object = (void *)0x0;
      local_f8._8_8_ = 0;
      local_f8._M_unused._M_object = operator_new(0x10);
      *(element_type **)local_f8._M_unused._0_8_ = this_01;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_f8._M_unused._0_8_ + 8) =
           _Var3._M_pi;
      pcStack_e0 = std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/tcp_proxy.cpp:54:59)>
                   ::_M_invoke;
      local_e8 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/tcp_proxy.cpp:54:59)>
                 ::_M_manager;
      TVar11 = Liby::TimerMixin::runAfter
                         (&this_01->super_TimerMixin,&local_78,(BasicHandler *)&local_f8);
      if (local_e8 != (code *)0x0) {
        (*local_e8)(&local_f8,&local_f8,__destroy_functor);
      }
      std::__shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<Liby::Connection,void>
                (local_c8,(__weak_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2> *)
                          &conn->super_enable_shared_from_this<Liby::Connection>);
      if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_c0->_M_weak_count = local_c0->_M_weak_count + 1;
          UNLOCK();
        }
        else {
          local_c0->_M_weak_count = local_c0->_M_weak_count + 1;
        }
      }
      pTVar2 = tcpClient.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
        pTVar2 = tcpClient.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_c0->_M_weak_count = local_c0->_M_weak_count + 1;
          UNLOCK();
        }
        else {
          local_c0->_M_weak_count = local_c0->_M_weak_count + 1;
        }
      }
      local_e8 = (code *)0x0;
      pcStack_e0 = (code *)0x0;
      local_f8._M_unused._M_object = (void *)0x0;
      local_f8._8_8_ = 0;
      local_f8._M_unused._M_object = operator_new(0x28);
      *(TcpProxy **)local_f8._M_unused._0_8_ = this;
      *(undefined ***)((long)local_f8._M_unused._0_8_ + 8) = &PTR__ProxyContext_00130170;
      *(__shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2> (*) [8])
       ((long)local_f8._M_unused._0_8_ + 0x10) = local_c8;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_f8._M_unused._0_8_ + 0x18) =
           local_c0;
      *(TimerId *)((long)local_f8._M_unused._0_8_ + 0x20) = TVar11;
      pcStack_e0 = std::
                   _Function_handler<void_(std::shared_ptr<Liby::Connection>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/tcp_proxy.cpp:57:30)>
                   ::_M_invoke;
      local_e8 = std::
                 _Function_handler<void_(std::shared_ptr<Liby::Connection>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/tcp_proxy.cpp:57:30)>
                 ::_M_manager;
      Liby::TcpClient::onConnect(pTVar2,(Connector *)&local_f8);
      if (local_e8 != (code *)0x0) {
        (*local_e8)(&local_f8,&local_f8,__destroy_functor);
      }
      if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = &local_c0->_M_weak_count;
          iVar5 = *p_Var1;
          *p_Var1 = *p_Var1 + -1;
          UNLOCK();
        }
        else {
          iVar5 = local_c0->_M_weak_count;
          local_c0->_M_weak_count = iVar5 + -1;
        }
        if (iVar5 == 1) {
          (*local_c0->_vptr__Sp_counted_base[3])(local_c0);
        }
      }
      if (tcpClient.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (tcpClient.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)service._M_dataplus._M_p != &service.field_2) {
        operator_delete(service._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)host._M_dataplus._M_p != &host.field_2) {
        operator_delete(host._M_dataplus._M_p);
      }
    }
  }
  return;
}

Assistant:

void handleConnectRequest(Connection &conn) {
        Buffer &readBuf = conn.read();
        if (readBuf.size() < 9) {
            return;
        }

        char *base = readBuf.data();

        char ver = base[0];
        char command = base[1];

        if (ver != 4 || command != 1) {
            error("bad version %d or command %d", ver, command);
            conn.destroy();
            return;
        }

        char address[50];
        if (::inet_ntop(AF_INET, base + 4, address, 50) == nullptr) {
            conn.destroy();
            return;
        }

        string host = address;
        string service = to_string(ntohs(*(uint16_t *)(base + 2)));

        info("host: %s service: %s", host.data(), service.data());
        readBuf.retrieve();

        shared_ptr<TcpClient> tcpClient = group_.creatTcpClient(host, service);
        TimerId id = tcpClient->runAfter(Timestamp(8, 0), [tcpClient] {});

        ProxyContext context = conn.shared_from_this();
        tcpClient->onConnect([this, context, id](shared_ptr<Connection> c) {
            if (c && !context.weak_conn.expired()) {
                ProxyContext context1 = c;
                c->context_ = make_shared<ProxyContext>(context);
                auto c1 = context.weak_conn.lock();
                c1->context_ = make_shared<ProxyContext>(context1);

                c->onRead(
                    [this](Connection &connection) { onRead(connection); });
                c->onErro(
                    [this](Connection &connection) { onErro(connection); });
                c1->onRead(
                    [this](Connection &connection) { onRead(connection); });
                c1->onErro(
                    [this](Connection &connection) { onErro(connection); });
                c->enableRead();
                c1->enableRead();

                char response[8];
                response[0] = 0x0;
                response[1] = 0x5A;
                c1->send(response, 8);

                return;
            }

            if (c) {
                c->destroy();
            }

            if (!context.weak_conn.expired()) {
                context.weak_conn.lock()->destroy();
            }
        });
    }